

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::M3DImporter::importBones(M3DImporter *this,M3DWrapper *m3d,uint parentid,aiNode *pParent)

{
  M3DWrapper *m3d_00;
  uint uVar1;
  Logger *this_00;
  aiNode **ppaVar2;
  aiNode *this_01;
  m3d_t *pmVar3;
  m3db_t *pmVar4;
  uint uVar5;
  size_t __n;
  uint uVar6;
  ulong uVar7;
  M3DImporter *this_02;
  M3DImporter *pMVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  allocator<char> local_479;
  M3DWrapper *local_478;
  M3DImporter *local_470;
  ulong local_468;
  undefined1 local_460 [40];
  undefined1 local_438 [1032];
  
  if (pParent == (aiNode *)0x0) {
    __assert_fail("pParent != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x1e4,
                  "void Assimp::M3DImporter::importBones(const M3DWrapper &, unsigned int, aiNode *)"
                 );
  }
  if (this->mScene != (aiScene *)0x0) {
    if (m3d->m3d_ != (m3d_t *)0x0) {
      uVar10 = (ulong)parentid;
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[18]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 (char (*) [18])"M3D: importBones ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," parentid ",10);
      std::ostream::operator<<(local_438,parentid);
      std::__cxx11::stringbuf::str();
      Logger::debug(this_00,(char *)local_470);
      local_460._32_8_ = this;
      if (local_470 != (M3DImporter *)local_460) {
        operator_delete(local_470,local_460._0_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
      uVar5 = parentid + 1;
      uVar1 = m3d->m3d_->numbone;
      uVar7 = 0;
      uVar9 = (ulong)uVar5;
      if (uVar5 < uVar1) {
        pmVar4 = m3d->m3d_->bone + uVar9;
        uVar1 = uVar1 - 1;
        do {
          uVar6 = (int)uVar7 + (uint)(pmVar4->parent == parentid);
          uVar7 = (ulong)uVar6;
          pmVar4 = pmVar4 + 1;
          uVar1 = uVar1 - 1;
        } while (parentid != uVar1);
        uVar7 = (ulong)uVar6 << 3;
      }
      ppaVar2 = (aiNode **)operator_new__(uVar7);
      pParent->mChildren = ppaVar2;
      pmVar3 = m3d->m3d_;
      if (uVar5 < pmVar3->numbone) {
        lVar11 = uVar9 * 0x68;
        local_478 = m3d;
        local_460._16_8_ = uVar10;
        local_460._24_8_ = pParent;
        do {
          if (*(int *)((long)pmVar3->bone->mat4 + lVar11 + -0x28) == (int)uVar10) {
            this_01 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(this_01);
            this_01->mParent = pParent;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_470,
                       *(char **)((long)local_478->m3d_->bone->mat4 + lVar11 + -0x20),&local_479);
            pMVar8 = local_470;
            __n = local_468 & 0xffffffff;
            if ((local_468 & 0xfffffc00) != 0) {
              __n = 0x3ff;
            }
            memcpy(local_438 + 4,local_470,__n);
            local_438[__n + 4] = 0;
            (this_01->mName).length = (ai_uint32)__n;
            this_02 = (M3DImporter *)(this_01->mName).data;
            memcpy(this_02,local_438 + 4,__n);
            (this_01->mName).data[__n] = '\0';
            if (pMVar8 != (M3DImporter *)local_460) {
              operator_delete(pMVar8,local_460._0_8_ + 1);
              this_02 = pMVar8;
            }
            m3d_00 = local_478;
            pmVar4 = local_478->m3d_->bone;
            convertPose(this_02,local_478,&this_01->mTransformation,
                        *(uint *)((long)pmVar4->mat4 + lVar11 + -0x18),
                        *(uint *)((long)pmVar4->mat4 + lVar11 + -0x14));
            pParent = (aiNode *)local_460._24_8_;
            this_01->mNumChildren = 0;
            (*(aiNode ***)(local_460._24_8_ + 0x458))[*(uint *)(local_460._24_8_ + 0x450)] = this_01
            ;
            *(uint *)(local_460._24_8_ + 0x450) = *(uint *)(local_460._24_8_ + 0x450) + 1;
            importBones((M3DImporter *)local_460._32_8_,m3d_00,(uint)uVar9,this_01);
            pmVar3 = m3d_00->m3d_;
            uVar10 = local_460._16_8_;
          }
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 0x68;
        } while (uVar9 < pmVar3->numbone);
      }
      return;
    }
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x1e6,
                  "void Assimp::M3DImporter::importBones(const M3DWrapper &, unsigned int, aiNode *)"
                 );
  }
  __assert_fail("mScene != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x1e5,
                "void Assimp::M3DImporter::importBones(const M3DWrapper &, unsigned int, aiNode *)")
  ;
}

Assistant:

void M3DImporter::importBones(const M3DWrapper &m3d, unsigned int parentid, aiNode *pParent) {
	unsigned int i, n;

	ai_assert(pParent != nullptr);
	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	ASSIMP_LOG_DEBUG_F("M3D: importBones ", m3d->numbone, " parentid ", (int)parentid);

	for (n = 0, i = parentid + 1; i < m3d->numbone; i++)
		if (m3d->bone[i].parent == parentid) n++;
	pParent->mChildren = new aiNode *[n];

	for (i = parentid + 1; i < m3d->numbone; i++) {
		if (m3d->bone[i].parent == parentid) {
			aiNode *pChild = new aiNode;
			pChild->mParent = pParent;
			pChild->mName = aiString(std::string(m3d->bone[i].name));
			convertPose(m3d, &pChild->mTransformation, m3d->bone[i].pos, m3d->bone[i].ori);
			pChild->mNumChildren = 0;
			pParent->mChildren[pParent->mNumChildren] = pChild;
			pParent->mNumChildren++;
			importBones(m3d, i, pChild);
		}
	}
}